

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage_manager.cpp
# Opt level: O3

void __thiscall duckdb::StorageManager::Initialize(StorageManager *this,StorageOptions options)

{
  int iVar1;
  CatalogException *this_00;
  string local_40;
  
  iVar1 = ::std::__cxx11::string::compare((char *)&this->path);
  if ((iVar1 == 0) && (this->read_only == true)) {
    this_00 = (CatalogException *)__cxa_allocate_exception(0x10);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"Cannot launch in-memory database in read-only mode!","");
    CatalogException::CatalogException(this_00,&local_40);
    __cxa_throw(this_00,&CatalogException::typeinfo,::std::runtime_error::~runtime_error);
  }
  (*this->_vptr_StorageManager[10])(this);
  return;
}

Assistant:

void StorageManager::Initialize(StorageOptions options) {
	bool in_memory = InMemory();
	if (in_memory && read_only) {
		throw CatalogException("Cannot launch in-memory database in read-only mode!");
	}

	// Create or load the database from disk, if not in-memory mode.
	LoadDatabase(options);
}